

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::UnicodeSet::complementAll(UnicodeSet *this,UnicodeSet *c)

{
  UBool UVar1;
  int32_t iVar2;
  UnicodeString *s;
  void *e;
  int32_t i;
  UnicodeSet *c_local;
  UnicodeSet *this_local;
  
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    exclusiveOr(this,c->list,c->len,'\0');
    for (e._4_4_ = 0; iVar2 = UVector::size(c->strings), e._4_4_ < iVar2; e._4_4_ = e._4_4_ + 1) {
      s = (UnicodeString *)UVector::elementAt(c->strings,e._4_4_);
      UVar1 = UVector::removeElement(this->strings,s);
      if (UVar1 == '\0') {
        _add(this,s);
      }
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complementAll(const UnicodeSet& c) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    exclusiveOr(c.list, c.len, 0);

    for (int32_t i=0; i<c.strings->size(); ++i) {
        void* e = c.strings->elementAt(i);
        if (!strings->removeElement(e)) {
            _add(*(const UnicodeString*)e);
        }
    }
    return *this;
}